

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuiteResult.h
# Opt level: O0

void __thiscall
oout::SuiteResult::SuiteResult<oout::TestResult,oout::TestResult>
          (SuiteResult *this,shared_ptr<oout::TestResult> *tests,
          shared_ptr<oout::TestResult> *tests_1)

{
  initializer_list<std::shared_ptr<const_oout::Result>_> __l;
  shared_ptr<const_oout::Result> *local_a0;
  allocator<std::shared_ptr<const_oout::Result>_> local_69;
  shared_ptr<const_oout::Result> local_68;
  shared_ptr<oout::Result_const> local_58 [16];
  shared_ptr<const_oout::Result> local_48;
  list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
  local_38;
  shared_ptr<oout::TestResult> *local_20;
  shared_ptr<oout::TestResult> *tests_local_1;
  shared_ptr<oout::TestResult> *tests_local;
  SuiteResult *this_local;
  
  local_20 = tests_1;
  tests_local_1 = tests;
  tests_local = (shared_ptr<oout::TestResult> *)this;
  std::shared_ptr<oout::Result_const>::shared_ptr<oout::TestResult,void>
            ((shared_ptr<oout::Result_const> *)&local_68,tests);
  std::shared_ptr<oout::Result_const>::shared_ptr<oout::TestResult,void>(local_58,local_20);
  local_48.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
  local_48.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_68;
  std::allocator<std::shared_ptr<const_oout::Result>_>::allocator(&local_69);
  __l._M_len = (size_type)
               local_48.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
  __l._M_array = (iterator)
                 local_48.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::
  list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>::
  list(&local_38,__l,&local_69);
  SuiteResult(this,&local_38);
  std::__cxx11::
  list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>::
  ~list(&local_38);
  std::allocator<std::shared_ptr<const_oout::Result>_>::~allocator(&local_69);
  local_a0 = &local_48;
  do {
    local_a0 = local_a0 + -1;
    std::shared_ptr<const_oout::Result>::~shared_ptr(local_a0);
  } while (local_a0 != &local_68);
  return;
}

Assistant:

explicit SuiteResult(const std::shared_ptr<T> & ... tests)
		: SuiteResult(std::list<std::shared_ptr<const Result>>{
			tests...
		})
	{
	}